

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL_bool OpenSDL2AudioDevice(SDL_AudioSpec *appwant)

{
  Uint8 UVar1;
  uint uVar2;
  int iVar3;
  int local_3c;
  undefined1 local_38 [8];
  SDL_AudioSpec devwant;
  SDL_AudioSpec *appwant_local;
  
  UVar1 = 0x80;
  if ((appwant->format & 0x8000) != 0) {
    UVar1 = '\0';
  }
  appwant->silence = UVar1;
  uVar2 = appwant->format & 0xff;
  appwant->size = (uint)appwant->samples * (uint)appwant->channels * (uVar2 / 8);
  devwant.userdata = appwant;
  if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
    audio_cbdata = (AudioCallbackWrapperData *)(*SDL20_calloc)(1,0x3f68);
    if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
      (*SDL20_Error)(SDL_ENOMEM);
      appwant_local._4_4_ = SDL_FALSE;
    }
    else {
      (*SDL20_memcpy)(local_38,devwant.userdata,0x20);
      devwant._8_8_ = AudioCallbackWrapper;
      devwant.callback = (SDL_AudioCallback)audio_cbdata;
      if ((int)local_38._0_4_ < 0xac45) {
        local_3c = 0xac44;
      }
      else {
        local_3c = local_38._0_4_;
      }
      local_38._0_4_ = local_3c;
      if (local_38[6] < 3) {
        local_38[6] = 2;
      }
      if ((local_38._4_2_ & 0xff) < 0x10) {
        local_38._4_2_ = 0x8010;
      }
      iVar3 = (*SDL20_OpenAudio)((SDL_AudioSpec *)local_38,&audio_cbdata->device_format);
      if (iVar3 == -1) {
        SDL_free(audio_cbdata);
        audio_cbdata = (AudioCallbackWrapperData *)0x0;
        appwant_local._4_4_ = SDL_FALSE;
      }
      else {
        (*SDL20_LockAudio)();
        (*SDL20_PauseAudio)(0);
        appwant_local._4_4_ = SDL_TRUE;
      }
    }
  }
  else {
    (*SDL20_LockAudio)(appwant,8,(ulong)uVar2 % 8);
    appwant_local._4_4_ = SDL_TRUE;
  }
  return appwant_local._4_4_;
}

Assistant:

static SDL_bool
OpenSDL2AudioDevice(SDL_AudioSpec *appwant)
{
    SDL_AudioSpec devwant;

    /* note that 0x80 isn't perfect silence for U16 formats, but we only have one byte that is used for memset() calls, so it has to do. SDL2 has the same bug. */
    appwant->silence = SDL_AUDIO_ISSIGNED(appwant->format) ? 0x00 : 0x80;
    appwant->size = appwant->samples * appwant->channels * (SDL_AUDIO_BITSIZE(appwant->format) / 8);

    if (audio_cbdata != NULL) {  /* device is already open. */
        SDL20_LockAudio();  /* Device is already at acceptable parameters, just pause it for further setup by caller. */
        return SDL_TRUE;
    }

    audio_cbdata = (AudioCallbackWrapperData *) SDL20_calloc(1, sizeof (AudioCallbackWrapperData));
    if (!audio_cbdata) {
        SDL20_OutOfMemory();
        return SDL_FALSE;
    }

    /* Two things use the audio device: the app, through 1.2's SDL_OpenAudio,
       and the fake CD-ROM device. Either can open the device, and both write
       to SDL_AudioStreams to buffer and convert data. We open the device
       in a format that accommodates both inputs.

       In case the app asks for something really low-quality--an old game
       playing 8-bit mono audio at 8000Hz or whatever--we force the audio
       hardware to something better, in case the app _also_ wants to play
       CD audio, so we can get good quality out of that without reopening
       the device. We have to be able to buffer and convert between the
       app's needs and SDL2's anyhow, so this isn't a big deal. If they
       ask for better than CD quality, we'll allow it and upsample any
       CD audio that is played.

       If the CD-ROM is opened first, and the app wants better-than-CD
       quality later, there's not much we can do, it'll have to
       downsample, but I suspect this is rare, and the audio will
       still be good enough. */

    SDL20_memcpy(&devwant, appwant, sizeof (SDL_AudioSpec));
    devwant.callback = AudioCallbackWrapper;
    devwant.userdata = audio_cbdata;
    devwant.freq = SDL_max(devwant.freq, 44100);
    devwant.channels = SDL_max(devwant.channels, 2);
    if (SDL_AUDIO_BITSIZE(devwant.format) < 16) {
        devwant.format = AUDIO_S16SYS;
    }

    if (SDL20_OpenAudio(&devwant, &audio_cbdata->device_format) == -1) {
        SDL_free(audio_cbdata);
        audio_cbdata = NULL;
        return SDL_FALSE;
    }

    SDL20_LockAudio();
    SDL20_PauseAudio(0);  /* always unpause, but caller will unlock after finalizing setup. */

    return SDL_TRUE;
}